

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::PrepareCommittedResources
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CommittedShaderResources *Resources
          ,Uint32 *DvpCompatibleSRBCount)

{
  Uint32 UVar1;
  ShaderResourceBindingVkImpl *in_RAX;
  PipelineResourceSignatureImplType *pPVar2;
  PipelineResourceSignatureVkImpl *pPVar3;
  Uint32 i;
  Uint32 UVar4;
  bool bVar5;
  bool bVar6;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> pSRB;
  
  pSRB.m_pObject = in_RAX;
  UVar1 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                    (&((this->m_pPipelineState).m_pObject)->
                      super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  Resources->ActiveSRBMask = '\0';
  for (UVar4 = 0; UVar1 != UVar4; UVar4 = UVar4 + 1) {
    pPVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                       (&((this->m_pPipelineState).m_pObject)->
                         super_PipelineStateBase<Diligent::EngineVkImplTraits>,UVar4);
    if ((pPVar2 != (PipelineResourceSignatureImplType *)0x0) &&
       ((pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
        .m_Desc.NumResources != 0)) {
      Resources->ActiveSRBMask = Resources->ActiveSRBMask | (byte)(1 << ((byte)UVar4 & 0x1f));
    }
  }
  UVar4 = 0;
  do {
    *DvpCompatibleSRBCount = UVar4;
    if (UVar1 <= UVar4) {
LAB_001c088f:
      for (; UVar4 < UVar1; UVar4 = UVar4 + 1) {
        CommittedShaderResources::Set(Resources,UVar4,(ShaderResourceBindingImplType *)0x0);
      }
      Resources->ResourcesValidated = false;
      return;
    }
    RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Lock
              ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)&pSRB);
    pPVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                       (&((this->m_pPipelineState).m_pObject)->
                         super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                        *DvpCompatibleSRBCount);
    bVar6 = true;
    if (pSRB.m_pObject == (ShaderResourceBindingVkImpl *)0x0) {
      pPVar3 = (PipelineResourceSignatureVkImpl *)0x0;
    }
    else {
      pPVar3 = ((pSRB.m_pObject)->super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>).
               m_pPRS.m_pObject;
    }
    bVar5 = bVar6;
    if (pPVar2 != (PipelineResourceSignatureImplType *)0x0) {
      bVar5 = (pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              .m_Desc.NumResources == 0;
    }
    if (pPVar3 != (PipelineResourceSignatureVkImpl *)0x0) {
      bVar6 = (pPVar3->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              .m_Desc.NumResources == 0;
    }
    if ((bVar5 != bVar6) ||
       (((pPVar2 != (PipelineResourceSignatureImplType *)0x0 &&
         (pPVar3 != (PipelineResourceSignatureVkImpl *)0x0)) &&
        ((pPVar2->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_Hash !=
         (pPVar3->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_Hash)))) {
      RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release(&pSRB);
      UVar4 = *DvpCompatibleSRBCount;
      goto LAB_001c088f;
    }
    RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::Release(&pSRB);
    UVar4 = *DvpCompatibleSRBCount + 1;
  } while( true );
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::PrepareCommittedResources(CommittedShaderResources& Resources, Uint32& DvpCompatibleSRBCount)
{
    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();

    Resources.ActiveSRBMask = 0;
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        const PipelineResourceSignatureImplType* pSignature = m_pPipelineState->GetResourceSignature(i);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        Resources.ActiveSRBMask |= 1u << i;
    }

    DvpCompatibleSRBCount = 0;

#ifdef DILIGENT_DEVELOPMENT
    // Layout compatibility means that descriptor sets can be bound to a command buffer
    // for use by any pipeline created with a compatible pipeline layout, and without having bound
    // a particular pipeline first. It also means that descriptor sets can remain valid across
    // a pipeline change, and the same resources will be accessible to the newly bound pipeline.
    // (14.2.2. Pipeline Layouts, clause 'Pipeline Layout Compatibility')
    // https://www.khronos.org/registry/vulkan/specs/1.2-extensions/html/vkspec.html#descriptorsets-compatibility

    // Find the number of SRBs compatible with signatures in the current pipeline
    for (; DvpCompatibleSRBCount < SignCount; ++DvpCompatibleSRBCount)
    {
        RefCntAutoPtr<ShaderResourceBindingImplType> pSRB = Resources.SRBs[DvpCompatibleSRBCount].Lock();

        const PipelineResourceSignatureImplType* pPSOSign = m_pPipelineState->GetResourceSignature(DvpCompatibleSRBCount);
        const PipelineResourceSignatureImplType* pSRBSign = pSRB ? pSRB->GetSignature() : nullptr;

        if ((pPSOSign == nullptr || pPSOSign->GetTotalResourceCount() == 0) !=
            (pSRBSign == nullptr || pSRBSign->GetTotalResourceCount() == 0))
        {
            // One signature is null or empty while the other is not - SRB is not compatible with the PSO.
            break;
        }

        if (pPSOSign != nullptr && pSRBSign != nullptr && pPSOSign->IsIncompatibleWith(*pSRBSign))
        {
            // Signatures are incompatible
            break;
        }
    }

    // Unbind incompatible shader resources
    // A consequence of layout compatibility is that when the implementation compiles a pipeline
    // layout and maps pipeline resources to implementation resources, the mechanism for set N
    // should only be a function of sets [0..N].
    for (Uint32 sign = DvpCompatibleSRBCount; sign < SignCount; ++sign)
    {
        Resources.Set(sign, nullptr);
    }

    Resources.ResourcesValidated = false;
#endif
}